

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O1

IRType lj_opt_narrow_forl(jit_State *J,cTValue *tv)

{
  uint uVar1;
  IRType IVar2;
  double dVar3;
  
  uVar1 = J->flags;
  IVar2 = IRT_NUM;
  if ((uVar1 >> 0x15 & 1) != 0) {
    dVar3 = tv->n;
    if (((dVar3 == (double)(int)dVar3) && (!NAN(dVar3) && !NAN((double)(int)dVar3))) &&
       ((uVar1 >> 0x15 & 1) != 0)) {
      dVar3 = tv[1].n;
      if (((dVar3 == (double)(int)dVar3) && (!NAN(dVar3) && !NAN((double)(int)dVar3))) &&
         ((uVar1 >> 0x15 & 1) != 0)) {
        dVar3 = tv[2].n;
        if ((dVar3 == (double)(int)dVar3) && (!NAN(dVar3) && !NAN((double)(int)dVar3))) {
          dVar3 = tv[1].n + tv[2].n;
          IVar2 = IRT_IGC;
          if (0.0 <= tv[2].n) {
            if (2147483647.0 < dVar3) {
              return IRT_NUM;
            }
          }
          else if (dVar3 < -2147483648.0) {
            return IRT_NUM;
          }
        }
      }
    }
  }
  return IVar2;
}

Assistant:

IRType lj_opt_narrow_forl(jit_State *J, cTValue *tv)
{
  lj_assertJ(tvisnumber(&tv[FORL_IDX]) &&
	     tvisnumber(&tv[FORL_STOP]) &&
	     tvisnumber(&tv[FORL_STEP]),
	     "expected number types");
  /* Narrow only if the runtime values of start/stop/step are all integers. */
  if (narrow_forl(J, &tv[FORL_IDX]) &&
      narrow_forl(J, &tv[FORL_STOP]) &&
      narrow_forl(J, &tv[FORL_STEP])) {
    /* And if the loop index can't possibly overflow. */
    lua_Number step = numberVnum(&tv[FORL_STEP]);
    lua_Number sum = numberVnum(&tv[FORL_STOP]) + step;
    if (0 <= step ? (sum <= 2147483647.0) : (sum >= -2147483648.0))
      return IRT_INT;
  }
  return IRT_NUM;
}